

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

Any * __thiscall chaiscript::detail::Any::operator=(Any *this,Any *t_any)

{
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> _Var1;
  Data *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  Any((Any *)&local_18,t_any);
  _Var1._M_head_impl =
       (this->m_data)._M_t.
       super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
       ._M_t.
       super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
       .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl;
  (this->m_data)._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl =
       local_18._M_head_impl;
  if (_Var1._M_head_impl != (Data *)0x0) {
    local_18._M_head_impl = _Var1._M_head_impl;
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_Data + 8))();
  }
  return this;
}

Assistant:

Any &operator=(const Any &t_any) {
        Any copy(t_any);
        swap(copy);
        return *this;
      }